

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atcp.c
# Opt level: O3

void nn_atcp_term(nn_atcp *self)

{
  nn_fsm *self_00;
  
  self_00 = (nn_fsm *)(ulong)(uint)self->state;
  if (self->state == 1) {
    nn_list_item_term(&self->item);
    nn_fsm_event_term(&self->done);
    nn_fsm_event_term(&self->accepted);
    nn_stcp_term(&self->stcp);
    nn_usock_term(&self->usock);
    nn_fsm_term(&self->fsm);
    return;
  }
  nn_atcp_term_cold_1();
  nn_fsm_isidle(self_00);
  return;
}

Assistant:

void nn_atcp_term (struct nn_atcp *self)
{
    nn_assert_state (self, NN_ATCP_STATE_IDLE);

    nn_list_item_term (&self->item);
    nn_fsm_event_term (&self->done);
    nn_fsm_event_term (&self->accepted);
    nn_stcp_term (&self->stcp);
    nn_usock_term (&self->usock);
    nn_fsm_term (&self->fsm);
}